

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O0

Scale * icu_63::number::Scale::byDouble(Scale *__return_storage_ptr__,double multiplicand)

{
  UBool UVar1;
  DecNum *pDVar2;
  size_t in_RSI;
  DecNum *local_48;
  LocalPointerBase<icu_63::number::impl::DecNum> local_28;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  UErrorCode localError;
  double multiplicand_local;
  
  decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_ = U_ZERO_ERROR;
  pDVar2 = (DecNum *)UMemory::operator_new((UMemory *)0x60,in_RSI);
  local_48 = (DecNum *)0x0;
  if (pDVar2 != (DecNum *)0x0) {
    impl::DecNum::DecNum(pDVar2);
    local_48 = pDVar2;
  }
  LocalPointer<icu_63::number::impl::DecNum>::LocalPointer
            ((LocalPointer<icu_63::number::impl::DecNum> *)&local_28,local_48,
             (UErrorCode *)
             ((long)&decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr + 4));
  UVar1 = ::U_FAILURE(decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_);
  if (UVar1 == '\0') {
    pDVar2 = LocalPointerBase<icu_63::number::impl::DecNum>::operator->(&local_28);
    impl::DecNum::setTo(pDVar2,multiplicand,
                        (UErrorCode *)
                        ((long)&decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr + 4)
                       );
    UVar1 = ::U_FAILURE(decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_);
    if (UVar1 == '\0') {
      pDVar2 = LocalPointerBase<icu_63::number::impl::DecNum>::orphan(&local_28);
      Scale(__return_storage_ptr__,0,pDVar2);
    }
    else {
      Scale(__return_storage_ptr__,
            decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_);
    }
  }
  else {
    Scale(__return_storage_ptr__,
          decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_);
  }
  LocalPointer<icu_63::number::impl::DecNum>::~LocalPointer
            ((LocalPointer<icu_63::number::impl::DecNum> *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDouble(double multiplicand) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {0, decnum.orphan()};
}